

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmState *this_00;
  char *pcVar1;
  mapped_type *pmVar2;
  string fname;
  RuleHash hash;
  cmOutputConverter converter;
  allocator local_a9;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_60;
  string local_40;
  
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)&local_a8,AlgoMD5);
    cmCryptoHash::HashString(&local_40,(cmCryptoHash *)&local_a8,content);
    local_88 = *(undefined8 *)local_40._M_dataplus._M_p;
    uStack_80 = *(undefined8 *)(local_40._M_dataplus._M_p + 8);
    local_78 = *(undefined8 *)(local_40._M_dataplus._M_p + 0x10);
    uStack_70 = *(undefined8 *)(local_40._M_dataplus._M_p + 0x18);
    std::__cxx11::string::~string((string *)&local_40);
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)&local_a8);
    cmMakefile::GetStateSnapshot
              (*(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start);
    cmOutputConverter::cmOutputConverter
              ((cmOutputConverter *)&local_40,(cmStateSnapshot *)&local_a8);
    this_00 = cmMakefile::GetState
                        (*(this->Makefiles).
                          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    pcVar1 = cmState::GetBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_a9);
    cmOutputConverter::ConvertToRelativePath
              (&local_a8,(cmOutputConverter *)&local_40,&local_60,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&local_60);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,&local_a8);
    *(undefined8 *)(pmVar2->Data + 0x10) = local_78;
    *(undefined8 *)(pmVar2->Data + 0x18) = uStack_70;
    *(undefined8 *)pmVar2->Data = local_88;
    *(undefined8 *)(pmVar2->Data + 8) = uStack_80;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}